

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_SimpleArray<ON_3fPoint> * __thiscall
ON_3dPointListRef::To3fPointArray
          (ON_SimpleArray<ON_3fPoint> *__return_storage_ptr__,ON_3dPointListRef *this)

{
  uint uVar1;
  double dVar2;
  ON_3fPoint *pOVar3;
  double *pdVar4;
  float *pfVar5;
  int iVar6;
  ulong newcap;
  
  __return_storage_ptr__->_vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081d9d8;
  __return_storage_ptr__->m_a = (ON_3fPoint *)0x0;
  __return_storage_ptr__->m_count = 0;
  __return_storage_ptr__->m_capacity = 0;
  uVar1 = this->m_point_count;
  newcap = (ulong)uVar1;
  if (newcap != 0) {
    ON_SimpleArray<ON_3fPoint>::Reserve(__return_storage_ptr__,newcap);
    if ((-1 < (int)uVar1) && ((int)uVar1 <= __return_storage_ptr__->m_capacity)) {
      __return_storage_ptr__->m_count = uVar1;
    }
    pOVar3 = __return_storage_ptr__->m_a;
    if (this->m_dP == (double *)0x0) {
      if (this->m_fP != (float *)0x0) {
        uVar1 = this->m_point_stride;
        pfVar5 = this->m_fP + 2;
        while (iVar6 = (int)newcap, newcap = (ulong)(iVar6 - 1), iVar6 != 0) {
          pOVar3->x = pfVar5[-2];
          pOVar3->y = pfVar5[-1];
          pOVar3->z = *pfVar5;
          pOVar3 = pOVar3 + 1;
          pfVar5 = pfVar5 + uVar1;
        }
      }
    }
    else {
      uVar1 = this->m_point_stride;
      pdVar4 = this->m_dP + 2;
      while (iVar6 = (int)newcap, newcap = (ulong)(iVar6 - 1), iVar6 != 0) {
        dVar2 = pdVar4[-1];
        pOVar3->x = (float)pdVar4[-2];
        pOVar3->y = (float)dVar2;
        pOVar3->z = (float)*pdVar4;
        pOVar3 = pOVar3 + 1;
        pdVar4 = pdVar4 + uVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_3fPoint> ON_3dPointListRef::To3fPointArray() const
{
  ON_SimpleArray<ON_3fPoint> a;

  unsigned int i = m_point_count;
  if ( i > 0 )
  {
    a.Reserve(i);
    a.SetCount(i);
    float* dst = (float*)a.Array();
    if ( m_dP )
    {
      const double* src = m_dP;
      while(i--)
      {
        *dst++ = (float)src[0];
        *dst++ = (float)src[1];
        *dst++ = (float)src[2];
        src += m_point_stride;
      }
    }
    else if ( m_fP )
    {
      const float* src = m_fP;
      while(i--)
      {
        *dst++ = src[0];
        *dst++ = src[1];
        *dst++ = src[2];
        src += m_point_stride;
      }
    }
  }

  // Note: 
  //  ON_SimpleArray<ON_3fPoint> has rvalue copy constructor
  //  and operator=, so this return does not create a copy.
  return a;
}